

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_widget_is_mouse_clicked(nk_context *ctx,nk_buttons btn)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  undefined1 auVar7 [16];
  nk_rect rect;
  undefined4 extraout_EAX;
  int iVar8;
  nk_bool nVar9;
  nk_rect bounds;
  nk_rect local_48;
  float local_38;
  float fStack_34;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  undefined8 uStack_20;
  
  if (((ctx != (nk_context *)0x0) && (pnVar5 = ctx->current, pnVar5 != (nk_window *)0x0)) &&
     (ctx->active == pnVar5)) {
    pnVar6 = pnVar5->layout;
    uVar1 = (pnVar6->clip).x;
    uVar3 = (pnVar6->clip).y;
    uVar2 = (pnVar6->clip).w;
    uVar4 = (pnVar6->clip).h;
    local_38 = (float)(int)(float)uVar1;
    fStack_34 = (float)(int)(float)uVar3;
    uStack_30 = 0;
    local_28 = (float)(int)(float)uVar2;
    fStack_24 = (float)(int)(float)uVar4;
    uStack_20 = 0;
    nk_layout_peek(&local_48,ctx);
    auVar7._4_4_ = -(uint)(local_48.y < fStack_24 + fStack_34);
    auVar7._0_4_ = -(uint)(local_48.x < local_28 + local_38);
    auVar7._8_4_ = -(uint)(local_38 < local_48.w + local_48.x);
    auVar7._12_4_ = -(uint)(fStack_34 < local_48.h + local_48.y);
    iVar8 = movmskps(extraout_EAX,auVar7);
    if (iVar8 == 0xf) {
      rect.y = local_48.y;
      rect.x = local_48.x;
      rect.w = local_48.w;
      rect.h = local_48.h;
      nVar9 = nk_input_mouse_clicked(&ctx->input,btn,rect);
      return nVar9;
    }
  }
  return 0;
}

Assistant:

NK_API nk_bool
nk_widget_is_mouse_clicked(struct nk_context *ctx, enum nk_buttons btn)
{
struct nk_rect c, v;
struct nk_rect bounds;
NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
if (!ctx || !ctx->current || ctx->active != ctx->current)
return 0;

c = ctx->current->layout->clip;
c.x = (float)((int)c.x);
c.y = (float)((int)c.y);
c.w = (float)((int)c.w);
c.h = (float)((int)c.h);

nk_layout_peek(&bounds, ctx);
nk_unify(&v, &c, bounds.x, bounds.y, bounds.x + bounds.w, bounds.y + bounds.h);
if (!NK_INTERSECT(c.x, c.y, c.w, c.h, bounds.x, bounds.y, bounds.w, bounds.h))
return 0;
return nk_input_mouse_clicked(&ctx->input, btn, bounds);
}